

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall kpeg::JPEGEncoder::levelShiftComponents(JPEGEncoder *this)

{
  uint uVar1;
  Level LVar2;
  uint uVar3;
  Logger *pLVar4;
  element_type *peVar5;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  char *pcVar9;
  void *pvVar10;
  long in_RDI;
  int x;
  int y;
  Image *in_stack_fffffffffffffea8;
  __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffeb0;
  char *local_120;
  char *local_c0;
  string local_90 [84];
  uint local_3c;
  uint local_38;
  Level in_stack_ffffffffffffffcc;
  string local_28 [40];
  
  pLVar4 = Logger::get();
  LVar2 = Logger::getLevel(pLVar4);
  if (0 < (int)LVar2) {
    pLVar4 = Logger::get();
    poVar8 = Logger::getStream(pLVar4);
    Logger::levelStr_abi_cxx11_(in_stack_ffffffffffffffcc);
    poVar8 = std::operator<<(poVar8,local_28);
    poVar8 = std::operator<<(poVar8,"[ kpeg:");
    pcVar9 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
                     ,0x2f);
    if (pcVar9 == (char *)0x0) {
      local_c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
      ;
    }
    else {
      local_c0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
                         ,0x2f);
      local_c0 = local_c0 + 1;
    }
    poVar8 = std::operator<<(poVar8,local_c0);
    poVar8 = std::operator<<(poVar8,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar8,std::dec);
    poVar8 = (ostream *)std::ostream::operator<<(pvVar10,0x199);
    poVar8 = std::operator<<(poVar8," ] ");
    poVar8 = std::operator<<(poVar8,"Performing level shift on components...");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_28);
  }
  for (local_38 = 0; uVar1 = local_38, uVar3 = Image::getHeight((Image *)(in_RDI + 0x428)),
      uVar1 < uVar3; local_38 = local_38 + 1) {
    for (local_3c = 0; uVar1 = local_3c, uVar3 = Image::getWidth((Image *)(in_RDI + 0x428)),
        uVar1 < uVar3; local_3c = local_3c + 1) {
      Image::getFlPixelPtr(in_stack_fffffffffffffea8);
      peVar5 = std::
               __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffffeb0);
      pvVar6 = std::
               vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>
               ::operator[](peVar5,(long)(int)local_38);
      pvVar7 = std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>::operator[]
                         (pvVar6,(long)(int)local_3c);
      pvVar7->comp[0] = pvVar7->comp[0] - 128.0;
      std::
      shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
                     *)0x14bb05);
      Image::getFlPixelPtr(in_stack_fffffffffffffea8);
      peVar5 = std::
               __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffffeb0);
      pvVar6 = std::
               vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>
               ::operator[](peVar5,(long)(int)local_38);
      pvVar7 = std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>::operator[]
                         (pvVar6,(long)(int)local_3c);
      pvVar7->comp[1] = pvVar7->comp[1] - 128.0;
      std::
      shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
                     *)0x14bb71);
      Image::getFlPixelPtr(in_stack_fffffffffffffea8);
      peVar5 = std::
               __shared_ptr_access<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffffeb0);
      pvVar6 = std::
               vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>
               ::operator[](peVar5,(long)(int)local_38);
      pvVar7 = std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>::operator[]
                         (pvVar6,(long)(int)local_3c);
      pvVar7->comp[2] = pvVar7->comp[2] - 128.0;
      std::
      shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
      ::~shared_ptr((shared_ptr<std::vector<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>,_std::allocator<std::vector<kpeg::FPixel,_std::allocator<kpeg::FPixel>_>_>_>_>
                     *)0x14bbdd);
    }
  }
  pLVar4 = Logger::get();
  LVar2 = Logger::getLevel(pLVar4);
  if (0 < (int)LVar2) {
    pLVar4 = Logger::get();
    poVar8 = Logger::getStream(pLVar4);
    Logger::levelStr_abi_cxx11_(in_stack_ffffffffffffffcc);
    poVar8 = std::operator<<(poVar8,local_90);
    poVar8 = std::operator<<(poVar8,"[ kpeg:");
    pcVar9 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
                     ,0x2f);
    if (pcVar9 == (char *)0x0) {
      local_120 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
      ;
    }
    else {
      local_120 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/Encoder.cpp"
                          ,0x2f);
      local_120 = local_120 + 1;
    }
    poVar8 = std::operator<<(poVar8,local_120);
    poVar8 = std::operator<<(poVar8,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar8,std::dec);
    poVar8 = (ostream *)std::ostream::operator<<(pvVar10,0x1a5);
    poVar8 = std::operator<<(poVar8," ] ");
    poVar8 = std::operator<<(poVar8,"Level shift complete [OK]");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_90);
  }
  return;
}

Assistant:

void JPEGEncoder::levelShiftComponents()
    {
        LOG(Logger::Level::INFO) << "Performing level shift on components..." << std::endl;
        
        for ( int y = 0; y < m_image.getHeight(); ++y )
        {
            for ( int x = 0; x < m_image.getWidth(); ++x )
            {
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Y] -= 128;
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cb] -= 128;
                (*m_image.getFlPixelPtr())[y][x].comp[YCbCrComponents::Cr] -= 128;
            }
        }
        
        LOG(Logger::Level::INFO) << "Level shift complete [OK]" << std::endl;
        
//         for ( auto&& row : *m_image.getFlPixelPtr() )
//         {
//             for ( auto&& val : row )
//             {
//                 std::cout << val.comp[0] << "," << val.comp[1] << "," << val.comp[2] << "\t";
//             }
//             std::cout << std::endl;
//         }
//         std::cout << std::endl;
    }